

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

void __thiscall
TPZSparseBlockDiagonal<float>::Print
          (TPZSparseBlockDiagonal<float> *this,char *message,ostream *out,MatrixOutputFormat format)

{
  long lVar1;
  ostream *poVar2;
  int64_t iVar3;
  long *plVar4;
  ostream *poVar5;
  int in_ECX;
  ostream *in_RDX;
  ostream *in_RSI;
  char *in_RDI;
  TPZBlockDiagonal<float> *unaff_retaddr;
  int64_t i;
  int64_t last;
  int64_t first;
  int64_t ibl;
  int64_t nbl;
  int64_t local_48;
  int64_t local_30;
  
  TPZBlockDiagonal<float>::Print
            (unaff_retaddr,in_RDI,in_RSI,(MatrixOutputFormat)((ulong)in_RDX >> 0x20));
  if (in_ECX == 0) {
    poVar2 = std::operator<<(in_RDX,"Equations for each block ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    iVar3 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0xa0));
    for (local_30 = 0; local_30 < iVar3 + -1; local_30 = local_30 + 1) {
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xa0),local_30);
      local_48 = *plVar4;
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xa0),local_30 + 1);
      lVar1 = *plVar4;
      poVar2 = std::operator<<(in_RDX,"Block ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
      std::operator<<(poVar2," : ");
      for (; local_48 < lVar1; local_48 = local_48 + 1) {
        poVar2 = in_RDX;
        plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_48);
        poVar5 = (ostream *)std::ostream::operator<<(in_RDX,*plVar4);
        std::operator<<(poVar5," ");
        in_RDX = poVar2;
      }
      std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::Print(const char* message, std::ostream& out, const MatrixOutputFormat format) const
{
	TPZBlockDiagonal<TVar>::Print(message, out, format);
	if(format == EFormatted)
	{
		out << "Equations for each block " << endl;
		int64_t nbl = fBlockIndex.NElements()-1;
		int64_t ibl;
		for(ibl = 0; ibl<nbl ; ibl++)
		{
			int64_t first = fBlockIndex[ibl];
			int64_t last = fBlockIndex[ibl+1];
			out << "Block " << ibl << " : ";
			int64_t i;
			for(i=first; i<last; i++) out << fBlock[i] << " ";
			out << endl;
		}
	}
}